

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r6p_1lin.cpp
# Opt level: O3

int r6pSingleLin(MatrixXd *X,MatrixXd *u,MatrixXd *ud,int direction,double r0,int maxpow,
                RSSinglelinCameraPoseVector *results)

{
  double dVar1;
  PointerType ptr;
  double *pdVar2;
  undefined1 *puVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *p_00;
  double *pdVar7;
  Index IVar8;
  double *pdVar9;
  int k;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *other;
  void *pvVar10;
  bool bVar11;
  double pivtol;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  undefined1 auVar17 [16];
  long lVar18;
  int nroots;
  VectorXd b;
  VectorXd coeffs;
  MatrixXd A;
  MatrixXd RR;
  MatrixXd alpha;
  MatrixXd CC;
  MatrixXd AM;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator_1;
  DstEvaluatorType dstEvaluator;
  MatrixXcd sols;
  MatrixXd C0;
  MatrixXd C1;
  Matrix3d R;
  type tmp;
  AngleAxis<double> eaxn;
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> data;
  VectorXd wCt;
  double p [65];
  double proots [65];
  double roots [64];
  double solver_input [2475];
  assign_op<double,_double> local_590d;
  int local_590c;
  void *local_5908;
  MatrixXd *local_5900;
  double local_58f8;
  MatrixXd *local_58f0;
  Matrix<double,__1,_1,_0,__1,_1> local_58e8;
  DenseStorage<double,__1,__1,_1,_0> local_58d8;
  DenseStorage<double,__1,__1,__1,_0> local_58c8;
  DenseStorage<double,__1,__1,__1,_0> local_58a8;
  DenseStorage<double,__1,__1,__1,_0> local_5888;
  double *local_5870;
  long local_5868;
  long local_5860;
  DenseStorage<double,__1,__1,__1,_0> local_5858;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_5838;
  SrcXprType local_5818;
  double local_5808;
  RSSinglelinCameraPose *pRStack_5800;
  double local_57f8;
  double dStack_57f0;
  double local_57e8;
  double dStack_57e0;
  double local_57d8;
  DstXprType local_57c8;
  double local_5788;
  undefined8 uStack_5780;
  undefined1 local_5778 [16];
  variable_if_dynamic<long,__1> local_5768;
  RSSinglelinCameraPoseVector *local_5760;
  long local_5758;
  long local_5750;
  undefined1 local_5748 [24];
  undefined8 uStack_5730;
  undefined8 local_5728;
  void *local_5718 [3];
  Vector3d local_5700;
  Vector3d local_56e8;
  DenseStorage<double,__1,__1,__1,_0> local_56d0;
  DenseStorage<double,__1,__1,__1,_0> local_56b8;
  void *local_56a0;
  double adStack_5698 [2];
  double local_5688 [4];
  double dStack_5668;
  double local_5660;
  double local_5658;
  double dStack_5650;
  double local_5648 [2];
  Matrix<double,_3,_9,_0,_3,_9> local_5638;
  void *local_5558;
  double dStack_5550;
  double local_5548;
  undefined8 uStack_5540;
  Vector3d local_5538;
  AngleAxis<double> local_5518;
  DenseStorage<double,__1,__1,_1,_0> local_54f8;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *local_54e8;
  undefined8 local_54e0;
  double local_54d8 [2];
  RSSinglelinCameraPose local_54c8;
  undefined8 local_5458;
  undefined8 uStack_5450;
  undefined8 local_5448;
  undefined8 local_5440;
  double local_5438;
  double local_5430;
  double local_5428;
  double local_5420;
  double local_5418;
  double local_5410;
  double local_5408;
  double local_5400;
  double local_53f8;
  undefined1 local_53e8 [16];
  undefined1 local_53d8 [16];
  MatrixXd local_53c0;
  PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_53a8 [7];
  SrcXprType local_5198 [33];
  assign_op<double,_double> local_4f88 [512];
  double local_4d88 [15];
  undefined1 local_4d10 [19680];
  
  local_58d8.m_data = (double *)0x0;
  local_58d8.m_rows = 0;
  local_5900 = u;
  local_58f8 = r0;
  local_58f0 = X;
  local_5760 = results;
  pdVar2 = (double *)malloc(0x2760);
  if (pdVar2 == (double *)0x0) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = std::ostream::_M_insert<long>;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_58d8.m_rows = 0x4ec;
  other = (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           *)local_4d88;
  local_4d88[0] = 4.89124989382834e-322;
  local_4d88[1] = 8.05327002721232e-322;
  local_4d88[2] = 0.0;
  local_58d8.m_data = pdVar2;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_5870,other);
  pdVar2 = (local_58f0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  pdVar7 = (local_5900->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  pdVar9 = (ud->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  if (direction == 0) {
    R6P_cayley_linearized_prepare_data_C(pdVar2,pdVar7,pdVar9,local_58f8,local_4d88);
  }
  else {
    R6P_cayley_linearized_prepare_data_y_C(pdVar2,pdVar7,pdVar9,local_58f8,local_4d88);
  }
  local_54e8 = other;
  local_54e0 = 0xf;
  local_54d8[0] = 8.15208315638057e-322;
  puVar3 = local_4d10;
  lVar5 = 0;
  do {
    dVar13 = ABS(local_4d88[lVar5]);
    lVar6 = 0;
    do {
      dVar13 = dVar13 + ABS(*(double *)(puVar3 + lVar6));
      lVar6 = lVar6 + 0x78;
    } while (lVar6 != 0x4ce0);
    lVar6 = 0;
    do {
      *(double *)(other + lVar6) = *(double *)(other + lVar6) / (dVar13 / 165.0);
      lVar6 = lVar6 + 0x78;
    } while (lVar6 != 0x4d58);
    lVar5 = lVar5 + 1;
    puVar3 = puVar3 + 8;
    other = other + 8;
  } while (lVar5 != 0xf);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_53c0,
             (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_54e8);
  computeCoeffs(&local_53c0,(VectorXd *)&local_58d8);
  free(local_53c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
  ;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_54f8,&local_58d8);
  lVar5 = 0;
  do {
    local_5870[*(int *)((long)setupEliminationTemplate::iv1 + lVar5)] =
         local_54f8.m_data[*(int *)((long)setupEliminationTemplate::iv2 + lVar5)];
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x81f0);
  free(local_54f8.m_data);
  local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = local_5870;
  local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = local_5868;
  local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 99;
  local_53a8[0].m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  local_53a8[0].m_rowsTranspositions.m_indices.
  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = (int *)0x0;
  local_53a8[0].m_rowsTranspositions.m_indices.
  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = local_5868;
  local_53a8[0].m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (int *)&local_5870;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_5718,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>_> *)
             local_53a8);
  local_53a8[0].m_rowsTranspositions.m_indices.
  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (int *)(local_5860 + -0x40);
  local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = local_5870 +
           local_5868 *
           (long)local_53a8[0].m_rowsTranspositions.m_indices.
                 super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = local_5868;
  local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0x40;
  local_53a8[0].m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  local_53a8[0].m_rowsTranspositions.m_indices.
  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = local_5868;
  local_53a8[0].m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (int *)&local_5870;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_56a0,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>_> *)
             local_53a8);
  Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_53a8,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_5718);
  local_5888.m_data = (double *)0x0;
  local_5888.m_rows = 0;
  local_5888.m_cols = 0;
  local_5198[0].m_dec = local_53a8;
  local_5198[0].m_rhs = (Matrix<double,__1,__1,_0,__1,__1> *)&local_56a0;
  if ((adStack_5698[1] != 0.0 &&
       local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
       .m_cols != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)adStack_5698[1]),0)
      < local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_cols)) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = std::ostream::_M_insert<long>;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_5888,
             (long)adStack_5698[1] *
             local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols,
             local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols,(Index)adStack_5698[1]);
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,__1,__1,_0,__1,__1> *)&local_5888,local_5198,local_4f88);
  free(local_53a8[0].m_rowsTranspositions.m_indices.
       super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_53a8[0].m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free(local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
       .m_data);
  local_58a8.m_data = (double *)0x0;
  local_58a8.m_rows = 0;
  local_58a8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_58a8,0x1540,0x55,0x40);
  lVar5 = 0;
  do {
    while (local_58a8.m_cols < 1) {
      lVar5 = lVar5 + 1;
      if (lVar5 == 0x15) {
LAB_006462bd:
        local_5858.m_data = (double *)0x0;
        local_5858.m_rows = 0;
        local_5858.m_cols = 0;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_5858,0x1000,0x40,0x40);
        lVar5 = 0;
        pdVar2 = local_5858.m_data;
        do {
          if (0 < local_5858.m_cols) {
            pdVar7 = local_58a8.m_data + (int)(&DAT_0067d960)[lVar5];
            IVar8 = local_5858.m_cols;
            pdVar9 = pdVar2;
            do {
              *pdVar9 = *pdVar7;
              pdVar7 = pdVar7 + local_58a8.m_rows;
              pdVar9 = pdVar9 + local_5858.m_rows;
              IVar8 = IVar8 + -1;
            } while (IVar8 != 0);
          }
          lVar5 = lVar5 + 1;
          pdVar2 = pdVar2 + 1;
        } while (lVar5 != 0x40);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_56b8,&local_5858);
        p_00 = local_53a8;
        charpoly_danilevsky((MatrixXd *)&local_56b8,(double (*) [65])p_00,pivtol);
        free(local_56b8.m_data);
        lVar5 = 0x40;
        do {
          (&local_5198[0].m_dec)[lVar5] =
               (PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               (p_00->m_lu).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
          p_00 = (PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                 &(p_00->m_lu).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
          bVar11 = lVar5 != 0;
          lVar5 = lVar5 + -1;
        } while (bVar11);
        find_real_roots_sturm
                  ((double *)local_5198,0x40,(double *)local_4f88,&local_590c,maxpow,false);
        local_5748._16_8_ = (void *)0x0;
        uStack_5730 = 0;
        local_5728 = 0;
        lVar5 = (long)local_590c;
        if ((lVar5 != 0) &&
           (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar5),0) < 3)) {
          puVar4 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar4 = std::ostream::_M_insert<long>;
          __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        Eigen::DenseStorage<std::complex<double>,_-1,_-1,_-1,_0>::resize
                  ((DenseStorage<std::complex<double>,__1,__1,__1,_0> *)(local_5748 + 0x10),
                   lVar5 * 3,3,lVar5);
        iVar16 = local_590c;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_56d0,&local_5858);
        solve_xy_from_AM((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          *)&local_5638,(double *)local_4f88,iVar16,(MatrixXd *)&local_56d0);
        pvVar10 = (void *)local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.
                          m_storage.m_data.array[0];
        local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.
        array[0] = 0.0;
        local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.
        array[1] = 0.0;
        local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.
        array[2] = 0.0;
        free(local_56d0.m_data);
        if (0 < local_590c) {
          local_5750 = (long)direction;
          lVar5 = 0;
          local_5908 = pvVar10;
          do {
            dVar13 = *(double *)((long)pvVar10 + lVar5 * 0x18);
            local_53e8._8_8_ = dVar13;
            local_53e8._0_8_ = 0x3ff0000000000000;
            local_53d8 = *(undefined1 (*) [16])((long)pvVar10 + lVar5 * 0x18 + 8);
            auVar14._0_8_ =
                 local_53d8._8_8_ * local_53d8._8_8_ + dVar13 * dVar13 +
                 local_53d8._0_8_ * local_53d8._0_8_ + 1.0;
            if (0.0 < auVar14._0_8_) {
              auVar14._8_8_ = 0;
              auVar14 = sqrtpd(auVar14,auVar14);
              auVar15._0_8_ = auVar14._0_8_;
              auVar15._8_8_ = auVar15._0_8_;
              local_53e8 = divpd(local_53e8,auVar15);
              local_53d8 = divpd(local_53d8,auVar15);
            }
            quat2R((Vector4d *)local_53e8,(Matrix3d *)local_5688);
            Eigen::AngleAxis<double>::operator=
                      (&local_5518,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_5688);
            local_5558 = (void *)(local_5518.m_angle *
                                 local_5518.m_axis.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0]);
            dStack_5550 = local_5518.m_angle *
                          local_5518.m_axis.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[1];
            local_5548 = local_5518.m_angle *
                         local_5518.m_axis.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[2];
            uStack_5540 = 0;
            local_58c8.m_data = (double *)0x0;
            local_58c8.m_rows = 0;
            local_58c8.m_cols = 0;
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_58c8,0xa2,0x12,9);
            local_58e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data = (double *)0x0;
            local_58e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows = 0;
            local_5758 = lVar5;
            pdVar2 = (double *)malloc(0x90);
            if (pdVar2 == (double *)0x0) {
              puVar4 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar4 = std::ostream::_M_insert<long>;
              __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            local_58e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows = 0x12;
            lVar5 = 0;
            local_58e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data = pdVar2;
            do {
              local_5788 = (local_5900->
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                           m_storage.m_data[lVar5 * 2 + local_5750];
              uStack_5780 = 0;
              pdVar7 = (local_58f0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       ).m_storage.m_data;
              pdVar2 = pdVar7 + lVar5 * 3;
              local_5778._0_8_ = *pdVar2;
              local_5778._8_8_ = pdVar2[1];
              local_5768.m_value = (long)pdVar7[lVar5 * 3 + 2];
              local_5538.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] =
                   (double)local_5768.m_value * local_5658 +
                   (double)local_5778._8_8_ * local_5688[3] +
                   (double)local_5778._0_8_ * local_5688[0];
              local_5538.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1] =
                   (double)local_5768.m_value * dStack_5650 +
                   (double)local_5778._8_8_ * dStack_5668 + (double)local_5778._0_8_ * local_5688[1]
              ;
              local_5538.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[2] =
                   (double)local_5768.m_value * local_5648[0] +
                   (double)local_5778._8_8_ * local_5660 + (double)local_5778._0_8_ * local_5688[2];
              X_(&local_5538);
              local_5788 = local_5788 - local_58f8;
              local_57c8.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_rows.m_value = (long)-local_5788;
              local_5818.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)0x3;
              local_5808 = 1.48219693752374e-323;
              local_57f8 = 0.0;
              dStack_57f0 = 0.0;
              local_57e8 = 1.48219693752374e-323;
              local_5838.m_dst = (DstEvaluatorType *)local_5748;
              local_5838.m_src = (SrcEvaluatorType *)&local_57c8;
              local_5838.m_functor = &local_590d;
              local_5838.m_dstExpr = (DstXprType *)&local_5818;
              local_5818.m_dec =
                   (HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_54c8;
              pRStack_5800 = &local_54c8;
              local_57c8.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_xpr = (XprTypeNested)&local_5638;
              local_5748._0_8_ = &local_54c8;
              Eigen::internal::
              dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
              ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_3,_9,_0,_3,_9>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                     *)&local_5838);
              local_54c8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] = 1.0;
              local_54c8.f = 0.0;
              local_54c8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1] = 0.0;
              local_54c8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[2] = 0.0;
              local_54c8.rd = 1.0;
              local_5448 = 0;
              local_5458 = 0;
              uStack_5450 = 0;
              local_5440 = 0x3ff0000000000000;
              local_5438 = local_5788;
              local_5430 = local_5788 * 0.0;
              local_5418 = local_5788;
              local_53f8 = local_5788;
              pdVar2 = (local_5900->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       ).m_storage.m_data;
              local_56e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] = pdVar2[lVar5 * 2];
              local_56e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1] = pdVar2[lVar5 * 2 + 1];
              local_56e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[2] = 1.0;
              local_5428 = local_5430;
              local_5420 = local_5430;
              local_5410 = local_5430;
              local_5408 = local_5430;
              local_5400 = local_5430;
              X_(&local_56e8);
              local_57c8.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_data = local_58c8.m_data + lVar5 * 3;
              local_57c8.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_rows.m_value = 3;
              local_57c8.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_cols.m_value = 9;
              local_57c8.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_xpr = (XprTypeNested)&local_58c8;
              local_57c8.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_startCol.m_value = 0;
              local_57c8.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_outerStride = local_58c8.m_rows;
              lVar6 = 0x10;
              do {
                dVar13 = *(double *)
                          ((long)local_54c8.v.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array + lVar6);
                dVar12 = *(double *)((long)local_54d8 + lVar6);
                dVar1 = *(double *)((long)local_54d8 + lVar6 + 8);
                *(double *)((long)local_5648 + lVar6) =
                     dVar1 * (double)pRStack_5800 + dVar12 * (double)local_5818.m_dec +
                     dVar13 * local_57e8;
                *(double *)((long)local_5648 + lVar6 + 8) =
                     dVar1 * local_57f8 + dVar12 * (double)local_5818.m_rhs + dVar13 * dStack_57e0;
                *(double *)
                 ((long)local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.
                        m_storage.m_data.array + lVar6) =
                     dStack_57f0 * dVar1 + dVar13 * local_57d8 + local_5808 * dVar12;
                lVar6 = lVar6 + 0x18;
              } while (lVar6 != 0xe8);
              local_5748._0_8_ = &local_5638;
              local_5768.m_value = local_58c8.m_rows;
              local_5838.m_dst = (DstEvaluatorType *)local_5778;
              local_5838.m_src = (SrcEvaluatorType *)local_5748;
              local_5838.m_functor = &local_590d;
              local_5838.m_dstExpr = &local_57c8;
              local_57c8.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              m_startRow.m_value = lVar5 * 3;
              local_5778._0_8_ =
                   local_57c8.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                   .m_data;
              Eigen::internal::
              dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
              ::run(&local_5838);
              pdVar2 = (local_5900->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       ).m_storage.m_data;
              local_5700.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] = pdVar2[lVar5 * 2];
              local_5700.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1] = pdVar2[lVar5 * 2 | 1];
              local_5700.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[2] = 1.0;
              X_(&local_5700);
              pdVar7 = (local_58f0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       ).m_storage.m_data;
              pdVar2 = pdVar7 + lVar5 * 3;
              local_57c8.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_data = (PointerType)*pdVar2;
              local_57c8.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_rows.m_value = (long)pdVar2[1];
              local_57c8.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_cols.m_value = (long)pdVar7[lVar5 * 3 + 2];
              lVar6 = 0x10;
              do {
                dVar13 = *(double *)((long)local_5688 + lVar6);
                dVar12 = *(double *)((long)adStack_5698 + lVar6);
                dVar1 = *(double *)((long)adStack_5698 + lVar6 + 8);
                *(double *)((long)local_5648 + lVar6) =
                     dVar1 * -(double)pRStack_5800 + dVar12 * -(double)local_5818.m_dec +
                     dVar13 * -local_57e8;
                *(double *)((long)local_5648 + lVar6 + 8) =
                     dVar1 * -local_57f8 + dVar12 * -(double)local_5818.m_rhs +
                     dVar13 * -dStack_57e0;
                *(double *)
                 ((long)local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.
                        m_storage.m_data.array + lVar6) =
                     (dVar13 * -local_57d8 - dStack_57f0 * dVar1) - local_5808 * dVar12;
                lVar6 = lVar6 + 0x18;
              } while (lVar6 != 0x58);
              pdVar2 = local_58e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar5 * 3;
              dVar13 = local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.
                       m_storage.m_data.array[6] *
                       (double)local_57c8.
                               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                               .
                               super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                               .m_cols.m_value +
                       (double)local_57c8.
                               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                               .
                               super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                               .m_rows.m_value *
                       local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.
                       m_storage.m_data.array[3] +
                       (double)local_57c8.
                               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                               .
                               super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                               .m_data *
                       local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.
                       m_storage.m_data.array[0];
              dVar12 = local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.
                       m_storage.m_data.array[7] *
                       (double)local_57c8.
                               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                               .
                               super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                               .m_cols.m_value +
                       (double)local_57c8.
                               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                               .
                               super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                               .m_rows.m_value *
                       local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.
                       m_storage.m_data.array[4] +
                       (double)local_57c8.
                               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                               .
                               super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                               .m_data *
                       local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.
                       m_storage.m_data.array[1];
              if (((ulong)pdVar2 & 7) == 0) {
                if (((ulong)pdVar2 & 8) == 0) {
                  *pdVar2 = dVar13;
                  pdVar2[1] = dVar12;
                }
                else {
                  *pdVar2 = dVar13;
                  pdVar2[1] = dVar12;
                }
              }
              else {
                *pdVar2 = dVar13;
                pdVar2[1] = dVar12;
              }
              pdVar2[2] = (double)local_57c8.
                                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                                  .
                                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                                  .
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                                  .
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                                  .m_cols.m_value *
                          local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.
                          m_storage.m_data.array[8] +
                          (double)local_57c8.
                                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                                  .
                                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                                  .
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                                  .
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                                  .m_rows.m_value *
                          local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.
                          m_storage.m_data.array[5] +
                          (double)local_57c8.
                                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                                  .
                                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                                  .
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                                  .
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                                  .m_data *
                          local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.
                          m_storage.m_data.array[2];
              lVar5 = lVar5 + 1;
            } while (lVar5 != 6);
            Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                      ((HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_5638,
                       (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_58c8);
            pvVar10 = local_5908;
            local_5818.m_rhs = &local_58e8;
            local_54c8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[0] = 0.0;
            local_54c8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[1] = 0.0;
            local_5818.m_dec =
                 (HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_5638;
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_54c8,
                       (Index)local_5638.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage
                              .m_data.array[2],1);
            lVar5 = local_5758;
            Eigen::internal::
            Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
            ::run((Matrix<double,__1,_1,_0,__1,_1> *)&local_54c8,&local_5818,
                  (assign_op<double,_double> *)&local_57c8);
            free((void *)local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.
                         m_storage.m_data.array[5]);
            free((void *)local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.
                         m_storage.m_data.array[3]);
            free((void *)local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.
                         m_storage.m_data.array[0]);
            local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data
            .array[0] = (double)local_5558;
            local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data
            .array[1] = dStack_5550;
            local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data
            .array[2] = local_5548;
            local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data
            .array[3] = *(double *)
                         ((long)local_54c8.v.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[0] + 0x18);
            local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data
            .array[4] = *(double *)
                         ((long)local_54c8.v.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[0] + 0x20);
            local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data
            .array[5] = *(double *)
                         ((long)local_54c8.v.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[0] + 0x28);
            local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data
            .array[6] = *(double *)
                         local_54c8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[0];
            local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data
            .array[7] = *(double *)
                         ((long)local_54c8.v.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[0] + 8);
            local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data
            .array[8] = *(double *)
                         ((long)local_54c8.v.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[0] + 0x10);
            local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data
            .array[9] = *(double *)
                         ((long)local_54c8.v.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[0] + 0x30);
            local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data
            .array[10] = *(double *)
                          ((long)local_54c8.v.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0] + 0x38);
            local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data
            .array[0xb] = *(double *)
                           ((long)local_54c8.v.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[0] + 0x40);
            local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data
            .array[0xc] = 1.0;
            local_5638.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data
            .array[0xd] = 0.0;
            std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>::
            emplace_back<RSSinglelinCameraPose>(local_5760,(RSSinglelinCameraPose *)&local_5638);
            free((void *)local_54c8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[0]);
            free(local_58e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                 .m_data);
            free(local_58c8.m_data);
            lVar5 = lVar5 + 1;
          } while (lVar5 < local_590c);
        }
        free((void *)local_5748._16_8_);
        free(local_5858.m_data);
        free(local_58a8.m_data);
        free(local_5888.m_data);
        free(local_56a0);
        free(local_5718[0]);
        if (pvVar10 != (void *)0x0) {
          operator_delete(pvVar10);
        }
        free(local_5870);
        free(local_58d8.m_data);
        return 0;
      }
    }
    pdVar2 = local_5888.m_data + lVar5 + 0x4e;
    pdVar7 = local_58a8.m_data + lVar5;
    IVar8 = local_58a8.m_cols;
    do {
      *pdVar7 = -*pdVar2;
      auVar14 = _DAT_0066d160;
      pdVar2 = pdVar2 + local_5888.m_rows;
      pdVar7 = pdVar7 + local_58a8.m_rows;
      IVar8 = IVar8 + -1;
    } while (IVar8 != 0);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x15);
  if (0 < local_58a8.m_cols) {
    lVar5 = 0;
    pdVar2 = local_58a8.m_data;
    do {
      pdVar2 = pdVar2 + local_58a8.m_rows;
      iVar16 = (int)((ulong)lVar5 >> 0x20);
      lVar6 = -0x40;
      auVar17 = auVar14;
      do {
        lVar18 = auVar17._8_8_;
        pdVar7 = pdVar2 + lVar6;
        *(undefined4 *)pdVar7 = 0;
        *(uint *)((long)pdVar7 + 4) =
             -(uint)(auVar17._0_4_ == (int)lVar5 && auVar17._4_4_ == iVar16) & 0x3ff00000;
        *(undefined4 *)(pdVar7 + 1) = 0;
        *(uint *)((long)pdVar7 + 0xc) =
             -(uint)(auVar17._8_4_ == (int)lVar5 && auVar17._12_4_ == iVar16) & 0x3ff00000;
        auVar17._0_8_ = auVar17._0_8_ + 2;
        auVar17._8_8_ = lVar18 + 2;
        lVar6 = lVar6 + 2;
      } while (lVar6 != 0);
      lVar5 = lVar5 + 1;
    } while (lVar5 != local_58a8.m_cols);
  }
  goto LAB_006462bd;
}

Assistant:

int r6pSingleLin(const  Eigen::MatrixXd & X, const  Eigen::MatrixXd & u, const Eigen::MatrixXd & ud, int direction, double r0, int maxpow, RSSinglelinCameraPoseVector * results) {
	Eigen::VectorXd coeffs(1260);
	Eigen::MatrixXd CC = Eigen::MatrixXd::Zero(99, 163);

	double solver_input[2475];

	std::vector<Eigen::Vector3d> v;

	if (direction == 0) {
		R6P_cayley_linearized_prepare_data_C(X.data(), u.data(), ud.data(), r0, solver_input);
	}
	else {
		R6P_cayley_linearized_prepare_data_y_C(X.data(), u.data(), ud.data(), r0, solver_input);
	}

	Eigen::Map<Eigen::MatrixXd> data(solver_input, 15, 165);

	for (int j = 0; j < 15; j++)
	{
		data.row(j) /= data.row(j).cwiseAbs().mean();
	}

	computeCoeffs(data, coeffs);
	setupEliminationTemplate(coeffs, CC);

	Eigen::MatrixXd C0 = CC.leftCols(99);
	Eigen::MatrixXd C1 = CC.rightCols(64);
	

	Eigen::MatrixXd alpha = C0.partialPivLu().solve(C1);

	Eigen::MatrixXd RR(85, 64);
	for (int j = 0; j < 21; j++)
	{
		RR.row(j) = -alpha.row(78 + j);
	}


	RR.bottomRows(64) = Eigen::MatrixXd::Identity(64, 64);

	int AM_ind[] = { 78, 55, 40, 32, 28, 0, 1, 2, 31, 3, 4, 33, 5, 38, 37, 6, 7, 39, 8, 41, 42, 43, 9, 51, 49, 48, 10, 11, 50, 12, 52, 53, 54, 13, 56, 57, 58, 59, 14, 73, 69, 66, 65, 15, 16, 67, 68, 17, 70, 71, 72, 18, 74, 75, 76, 77, 19, 79, 80, 81, 82, 83, 84, 20 };
	Eigen::MatrixXd AM(64, 64);
	for (int j = 0; j < 64; j++)
	{
		AM.row(j) = RR.row(AM_ind[j]);
	}

	double p[65];
	charpoly_danilevsky(AM, p);


	int order = 64;
	double proots[65];
	double roots[64];
	int nroots;
	for (int j = 0; j <= order; j++) {
		proots[order - j] = p[j];
	}
	find_real_roots_sturm(proots, order, roots, &nroots, maxpow, 0);


	Eigen::MatrixXcd sols(3, nroots);

	v = solve_xy_from_AM(roots, nroots, AM);


	for (int j = 0; j < nroots; j++)
	{

		Eigen::Matrix3d R;
		Eigen::Vector4d q;
		q(0) = 1;
		q.segment(1, 3) = v[j];
		q.normalize();
		quat2R(q, R);

		Eigen::AngleAxis<double> eaxn = Eigen::AngleAxis<double>(R);

		Eigen::Vector3d eax = eaxn.axis()*eaxn.angle();
		//std::cout << R;
		Eigen::MatrixXd A(18, 9);
		Eigen::VectorXd b(18);
		for (int k = 0; k < 6; k++)
		{
			double dr = u(k * 2 + direction) - r0;
			Eigen::Matrix<double, 3, 9> temp;
			temp << -dr*X_(R*Eigen::Vector3d(X(k * 3), X(k * 3 + 1), X(k * 3 + 2))), Eigen::Matrix3d::Identity(), dr*Eigen::Matrix3d::Identity();

			A.block(k * 3, 0, 3, 9) = X_(Eigen::Vector3d(u(k * 2), u(k * 2 + 1), 1))*temp;

			b.segment(k * 3, 3) = -X_(Eigen::Vector3d(u(k * 2), u(k * 2 + 1), 1))*R*Eigen::Vector3d(X(k * 3), X(k * 3 + 1), X(k * 3 + 2));

		}

		Eigen::VectorXd wCt = A.householderQr().solve(b);


		results->push_back({eax, wCt.segment(3,3), wCt.segment(0,3), wCt.segment(6,3), 1, 0});

	}


	return 0;

}